

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::
DoSimdLoadExtend<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,wabt::interp::Simd<unsigned_char,(unsigned_char)8>>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  Simd<unsigned_short,_(unsigned_char)__b_> value;
  RunResult RVar1;
  byte local_51;
  undefined2 uStack_50;
  undefined2 uStack_4e;
  undefined2 uStack_4c;
  undefined2 uStack_4a;
  u8 i;
  Simd<unsigned_short,_(unsigned_char)__b_> result;
  Simd<unsigned_char,_(unsigned_char)__b_> local_28;
  Simd<unsigned_char,_(unsigned_char)__b_> val;
  Ptr *out_trap_local;
  Thread *this_local;
  
  result.v._8_8_ = instr._0_8_;
  val.v = (uchar  [8])out_trap;
  RVar1 = Load<wabt::interp::Simd<unsigned_char,(unsigned_char)8>>(this,instr,&local_28,out_trap);
  if (RVar1 == Ok) {
    for (local_51 = 0; local_51 < 8; local_51 = local_51 + 1) {
      *(ushort *)((long)&stack0xffffffffffffffb0 + (ulong)local_51 * 2) =
           (ushort)local_28.v[local_51];
    }
    value.v[4] = result.v[0];
    value.v[5] = result.v[1];
    value.v[6] = result.v[2];
    value.v[7] = result.v[3];
    value.v[0] = uStack_50;
    value.v[1] = uStack_4e;
    value.v[2] = uStack_4c;
    value.v[3] = uStack_4a;
    Push<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this,value);
    this_local._4_4_ = Ok;
  }
  else {
    this_local._4_4_ = Trap;
  }
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoSimdLoadExtend(Instr instr, Trap::Ptr* out_trap) {
  T val;
  if (Load<T>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result.v[i] = val.v[i];
  }
  Push(result);
  return RunResult::Ok;
}